

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86Mapping.c
# Opt level: O2

x86_reg X86_insn_reg_intel(uint id)

{
  insn_reg *piVar1;
  long lVar2;
  
  lVar2 = 0;
  do {
    if (lVar2 == 0x61) {
      return X86_REG_INVALID;
    }
    piVar1 = insn_regs_intel + lVar2;
    lVar2 = lVar2 + 1;
  } while (piVar1->insn != id);
  return *(x86_reg *)(&UNK_0024655c + lVar2 * 8);
}

Assistant:

x86_reg X86_insn_reg_intel(unsigned int id)
{
	unsigned int i;

	for (i = 0; i < ARR_SIZE(insn_regs_intel); i++) {
		if (insn_regs_intel[i].insn == id) {
			return insn_regs_intel[i].reg;
		}
	}

	// not found
	return 0;
}